

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Input::nextDocument(Input *this)

{
  bool bVar1;
  document_iterator local_28;
  document_iterator local_20;
  
  local_28 = document_iterator::operator++(&this->DocIterator);
  local_20 = yaml::Stream::end((this->Strm)._M_t.
                               super___uniq_ptr_impl<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::yaml::Stream_*,_std::default_delete<llvm::yaml::Stream>_>
                               .super__Head_base<0UL,_llvm::yaml::Stream_*,_false>._M_head_impl);
  bVar1 = document_iterator::operator==(&local_28,&local_20);
  return !bVar1;
}

Assistant:

bool Input::nextDocument() {
  return ++DocIterator != Strm->end();
}